

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O0

void eia608_dump(uint16_t cc_data)

{
  FILE *__stream;
  int iVar1;
  eia608_control_t eVar2;
  uint uVar3;
  uint16_t in_DI;
  int underline;
  int chan;
  int col;
  int row;
  char char2 [5];
  char char1 [5];
  char *text;
  eia608_style_t style;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar4;
  int local_2c;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffe7;
  uint3 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  char *pcVar6;
  eia608_style_t local_8;
  uint16_t local_2;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  uVar5 = 0;
  uVar3 = (uint)in_stack_ffffffffffffffe8;
  local_2 = in_DI;
  iVar1 = eia608_parity_varify(0);
  if (iVar1 == 0) {
    pcVar6 = "parity failed";
  }
  else {
    iVar1 = eia608_parity_strip(local_2);
    if (iVar1 == 0) {
      pcVar6 = "pad";
    }
    else {
      iVar1 = eia608_is_basicna(local_2);
      if (iVar1 == 0) {
        iVar1 = eia608_is_specialna(local_2);
        if (iVar1 == 0) {
          iVar1 = eia608_is_westeu(local_2);
          if (iVar1 == 0) {
            iVar1 = eia608_is_xds(local_2);
            if (iVar1 == 0) {
              iVar1 = eia608_is_midrowchange(local_2);
              if (iVar1 == 0) {
                iVar1 = eia608_is_norpak(local_2);
                if (iVar1 == 0) {
                  iVar1 = eia608_is_preamble(local_2);
                  if (iVar1 == 0) {
                    iVar1 = eia608_is_control(local_2);
                    if (iVar1 == 0) {
                      pcVar6 = "unhandled";
                    }
                    else {
                      eVar2 = eia608_parse_control(local_2,(int *)&stack0xffffffffffffffd8);
                      if (eVar2 == eia608_control_resume_caption_loading) {
                        pcVar6 = "eia608_control_resume_caption_loading";
                      }
                      else if (eVar2 == eia608_control_backspace) {
                        pcVar6 = "eia608_control_backspace";
                      }
                      else if (eVar2 == eia608_control_alarm_off) {
                        pcVar6 = "eia608_control_alarm_off";
                      }
                      else if (eVar2 == eia608_control_alarm_on) {
                        pcVar6 = "eia608_control_alarm_on";
                      }
                      else if (eVar2 == eia608_control_delete_to_end_of_row) {
                        pcVar6 = "eia608_control_delete_to_end_of_row";
                      }
                      else if (eVar2 == eia608_control_roll_up_2) {
                        pcVar6 = "eia608_control_roll_up_2";
                      }
                      else if (eVar2 == eia608_control_roll_up_3) {
                        pcVar6 = "eia608_control_roll_up_3";
                      }
                      else if (eVar2 == eia608_control_roll_up_4) {
                        pcVar6 = "eia608_control_roll_up_4";
                      }
                      else if (eVar2 == eia608_control_resume_direct_captioning) {
                        pcVar6 = "eia608_control_resume_direct_captioning";
                      }
                      else if (eVar2 == eia608_control_text_restart) {
                        pcVar6 = "eia608_control_text_restart";
                      }
                      else if (eVar2 == eia608_control_text_resume_text_display) {
                        pcVar6 = "eia608_control_text_resume_text_display";
                      }
                      else if (eVar2 == eia608_control_erase_display_memory) {
                        pcVar6 = "eia608_control_erase_display_memory";
                      }
                      else if (eVar2 == eia608_control_carriage_return) {
                        pcVar6 = "eia608_control_carriage_return";
                      }
                      else if (eVar2 == eia608_control_erase_non_displayed_memory) {
                        pcVar6 = "eia608_control_erase_non_displayed_memory";
                      }
                      else if (eVar2 == eia608_control_end_of_caption) {
                        pcVar6 = "eia608_control_end_of_caption";
                      }
                      else if (eVar2 == eia608_tab_offset_0) {
                        pcVar6 = "eia608_tab_offset_0";
                      }
                      else if (eVar2 == eia608_tab_offset_1) {
                        pcVar6 = "eia608_tab_offset_1";
                      }
                      else if (eVar2 == eia608_tab_offset_2) {
                        pcVar6 = "eia608_tab_offset_2";
                      }
                      else if (eVar2 == eia608_tab_offset_3) {
                        pcVar6 = "eia608_tab_offset_3";
                      }
                      else {
                        pcVar6 = "unknown_control";
                      }
                    }
                  }
                  else {
                    pcVar6 = "preamble";
                    eia608_parse_preamble
                              (local_2,(int *)&stack0xffffffffffffffe0,
                               (int *)&stack0xffffffffffffffdc,&local_8,
                               (int *)&stack0xffffffffffffffd8,&local_2c);
                    fprintf(_stderr,"preamble %d %d %d %d %d\n",(ulong)in_stack_ffffffffffffffe0,
                            (ulong)in_stack_ffffffffffffffdc,(ulong)local_8,
                            (ulong)in_stack_ffffffffffffffd8,CONCAT44(uVar4,local_2c));
                  }
                }
                else {
                  pcVar6 = "norpak";
                }
              }
              else {
                pcVar6 = "midrowchange";
              }
            }
            else {
              pcVar6 = "xds";
            }
          }
          else {
            pcVar6 = "westeu";
            eia608_to_utf8(0,(int *)CONCAT44(in_stack_ffffffffffffffec,uVar3),
                           (char *)CONCAT17(in_stack_ffffffffffffffe7,
                                            CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffffe4,
                                                                    in_stack_ffffffffffffffe0))),
                           (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          }
        }
        else {
          pcVar6 = "specialna";
          eia608_to_utf8(0,(int *)CONCAT44(in_stack_ffffffffffffffec,uVar3),
                         (char *)CONCAT17(in_stack_ffffffffffffffe7,
                                          CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffffe4,
                                                                  in_stack_ffffffffffffffe0))),
                         (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        }
      }
      else {
        pcVar6 = "basicna";
        eia608_to_utf8(0,(int *)CONCAT44(in_stack_ffffffffffffffec,uVar3),
                       (char *)CONCAT17(in_stack_ffffffffffffffe7,
                                        CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffffe4,
                                                                in_stack_ffffffffffffffe0))),
                       (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      }
    }
  }
  __stream = _stderr;
  uVar3 = eia608_parity_strip(local_2);
  fprintf(__stream,"cc %04X (%04X) \'%s\' \'%s\' (%s)\n",(ulong)local_2,(ulong)uVar3,
          &stack0xffffffffffffffeb,&stack0xffffffffffffffe6,pcVar6);
  return;
}

Assistant:

void eia608_dump(uint16_t cc_data)
{
    eia608_style_t style;
    const char* text = 0;
    char char1[5], char2[5];
    char1[0] = char2[0] = 0;
    int row, col, chan, underline;

    if (!eia608_parity_varify(cc_data)) {
        text = "parity failed";
    } else if (0 == eia608_parity_strip(cc_data)) {
        text = "pad";
    } else if (eia608_is_basicna(cc_data)) {
        text = "basicna";
        eia608_to_utf8(cc_data, &chan, &char1[0], &char2[0]);
    } else if (eia608_is_specialna(cc_data)) {
        text = "specialna";
        eia608_to_utf8(cc_data, &chan, &char1[0], &char2[0]);
    } else if (eia608_is_westeu(cc_data)) {
        text = "westeu";
        eia608_to_utf8(cc_data, &chan, &char1[0], &char2[0]);
    } else if (eia608_is_xds(cc_data)) {
        text = "xds";
    } else if (eia608_is_midrowchange(cc_data)) {
        text = "midrowchange";
    } else if (eia608_is_norpak(cc_data)) {
        text = "norpak";
    } else if (eia608_is_preamble(cc_data)) {
        text = "preamble";
        eia608_parse_preamble(cc_data, &row, &col, &style, &chan, &underline);
        fprintf(stderr, "preamble %d %d %d %d %d\n", row, col, style, chan, underline);

    } else if (eia608_is_control(cc_data)) {
        switch (eia608_parse_control(cc_data, &chan)) {

        default:
            text = "unknown_control";
            break;

        case eia608_tab_offset_0:
            text = "eia608_tab_offset_0";
            break;

        case eia608_tab_offset_1:
            text = "eia608_tab_offset_1";
            break;

        case eia608_tab_offset_2:
            text = "eia608_tab_offset_2";
            break;

        case eia608_tab_offset_3:
            text = "eia608_tab_offset_3";
            break;

        case eia608_control_resume_caption_loading:
            text = "eia608_control_resume_caption_loading";
            break;

        case eia608_control_backspace:
            text = "eia608_control_backspace";
            break;

        case eia608_control_alarm_off:
            text = "eia608_control_alarm_off";
            break;

        case eia608_control_alarm_on:
            text = "eia608_control_alarm_on";
            break;

        case eia608_control_delete_to_end_of_row:
            text = "eia608_control_delete_to_end_of_row";
            break;

        case eia608_control_roll_up_2:
            text = "eia608_control_roll_up_2";
            break;

        case eia608_control_roll_up_3:
            text = "eia608_control_roll_up_3";
            break;

        case eia608_control_roll_up_4:
            text = "eia608_control_roll_up_4";
            break;

        case eia608_control_resume_direct_captioning:
            text = "eia608_control_resume_direct_captioning";
            break;

        case eia608_control_text_restart:
            text = "eia608_control_text_restart";
            break;

        case eia608_control_text_resume_text_display:
            text = "eia608_control_text_resume_text_display";
            break;

        case eia608_control_erase_display_memory:
            text = "eia608_control_erase_display_memory";
            break;

        case eia608_control_carriage_return:
            text = "eia608_control_carriage_return";
            break;

        case eia608_control_erase_non_displayed_memory:
            text = "eia608_control_erase_non_displayed_memory";
            break;

        case eia608_control_end_of_caption:
            text = "eia608_control_end_of_caption";
            break;
        }
    } else {
        text = "unhandled";
    }

    fprintf(stderr, "cc %04X (%04X) '%s' '%s' (%s)\n", cc_data, eia608_parity_strip(cc_data), char1, char2, text);
}